

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLUri::setPort(XMLUri *this,int newPort)

{
  MalformedURLException *this_00;
  XMLCh value1 [65];
  XMLCh local_a8 [72];
  
  if ((uint)newPort < 0x10000) {
    if (this->fHost != (XMLCh *)0x0) {
LAB_00254332:
      this->fPort = newPort;
      return;
    }
    XMLString::binToText(newPort,local_a8,0x40,10,this->fMemoryManager);
    this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
               ,0x4cb,XMLNUM_URI_NullHost,(XMLCh *)errMsg_PORT,local_a8,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
  }
  else {
    if (newPort == -1) goto LAB_00254332;
    XMLString::binToText(newPort,local_a8,0x40,10,this->fMemoryManager);
    this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
               ,0x4d5,XMLNUM_URI_PortNo_Invalid,local_a8,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
  }
  __cxa_throw(this_00,&MalformedURLException::typeinfo,XMLException::~XMLException);
}

Assistant:

void XMLUri::setPort(int newPort)
{
    if (newPort >= 0 && newPort <= 65535)
    {
        if (!getHost())
        {
            XMLCh value1[BUF_LEN+1];
            XMLString::binToText(newPort, value1, BUF_LEN, 10, fMemoryManager);
            ThrowXMLwithMemMgr2(MalformedURLException
                    , XMLExcepts::XMLNUM_URI_NullHost
                    , errMsg_PORT
                    , value1
                    , fMemoryManager);
        }
    }
    else if (newPort != -1)
    {
        XMLCh value1[BUF_LEN+1];
        XMLString::binToText(newPort, value1, BUF_LEN, 10, fMemoryManager);
        ThrowXMLwithMemMgr1(MalformedURLException
                , XMLExcepts::XMLNUM_URI_PortNo_Invalid
                , value1
                , fMemoryManager);
    }

    fPort = newPort;
}